

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

void __thiscall Minisat::OnlineProofChecker::printState(OnlineProofChecker *this)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  Lit LVar4;
  ostream *poVar5;
  Clause *this_00;
  Lit *in_RDI;
  int j;
  Clause *clause;
  int i_1;
  int i;
  Ref in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_10;
  int local_c;
  
  if (1 < in_RDI[0x3e].x) {
    fullCheck(this);
    poVar5 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] STATE:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    for (local_c = 0; iVar1 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0xc)),
        local_c < iVar1; local_c = local_c + 1) {
      vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)(in_RDI + 0xc),local_c);
      poVar5 = operator<<((ostream *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_RDI);
      poVar5 = std::operator<<(poVar5," 0");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    for (local_10 = 0; iVar1 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 8)),
        local_10 < iVar1; local_10 = local_10 + 1) {
      vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 8),local_10);
      this_00 = ClauseAllocator::operator[]
                          ((ClauseAllocator *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
      uVar2 = Clause::mark(this_00);
      if (uVar2 == 0) {
        in_stack_ffffffffffffffc4 = 0;
        while (iVar1 = in_stack_ffffffffffffffc4, iVar3 = Clause::size(this_00),
              in_stack_ffffffffffffffc4 < iVar3) {
          LVar4 = Clause::operator[](this_00,iVar1);
          poVar5 = operator<<((ostream *)CONCAT44(iVar1,LVar4.x),in_RDI);
          std::operator<<(poVar5," ");
          in_stack_ffffffffffffffc4 = iVar1 + 1;
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,"0");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

inline void OnlineProofChecker::printState()
{
    if (verbose < 2) {
        return;
    }

    fullCheck();

    std::cerr << "c [DRAT-OTFC] STATE:" << std::endl;
    for (int i = 0; i < unitClauses.size(); ++i) {
        std::cerr << unitClauses[i] << " 0" << std::endl;
    }
    for (int i = 0; i < clauses.size(); ++i) {
        const Clause &clause = ca[clauses[i]];
        if (clause.mark() != 0) {
            continue;
        } // jump over this clause
        for (int j = 0; j < clause.size(); ++j) {
            std::cerr << clause[j] << " ";
        }
        std::cerr << "0" << std::endl;
    }
}